

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_set_lexicon.h
# Opt level: O0

int32 __thiscall
IdSetLexicon::Add<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (IdSetLexicon *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  reference piVar5;
  ostream *poVar6;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  IdSetLexicon *local_20;
  IdSetLexicon *this_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  local_20 = this;
  this_local = (IdSetLexicon *)end._M_current;
  end_local = begin;
  std::vector<int,_std::allocator<int>_>::clear(&this->tmp_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&end_local,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (!bVar2) {
      iVar4 = AddInternal(this,&this->tmp_);
      return iVar4;
    }
    piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&end_local);
    local_39 = 0;
    if (*piVar5 < 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/id_set_lexicon.h"
                 ,0xbb,kFatal,(ostream *)&std::cerr);
      local_39 = 1;
      poVar6 = S2LogMessage::stream(&local_38);
      poVar6 = std::operator<<(poVar6,"Check failed: (*begin) >= (0) ");
      S2LogMessageVoidify::operator&(&local_21,poVar6);
    }
    if ((local_39 & 1) != 0) break;
    piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&end_local);
    iVar1 = *piVar5;
    iVar3 = std::numeric_limits<int>::max();
    if (iVar3 < iVar1) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/id_set_lexicon.h"
                 ,0xbc,kFatal,(ostream *)&std::cerr);
      poVar6 = S2LogMessage::stream(&local_60);
      poVar6 = std::operator<<(poVar6,
                               "Check failed: (*begin) <= (std::numeric_limits<int32>::max()) ");
      S2LogMessageVoidify::operator&(local_4d,poVar6);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
    }
    piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&end_local);
    std::vector<int,_std::allocator<int>_>::push_back(&this->tmp_,piVar5);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&end_local);
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
}

Assistant:

int32 IdSetLexicon::Add(FwdIterator begin, FwdIterator end) {
  tmp_.clear();
  for (; begin != end; ++begin) {
    S2_DCHECK_GE(*begin, 0);
    S2_DCHECK_LE(*begin, std::numeric_limits<int32>::max());
    tmp_.push_back(*begin);
  }
  return AddInternal(&tmp_);
}